

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreEarlyFragmentTestsTest::buildPrograms
          (ImageLoadStoreEarlyFragmentTestsTest *this)

{
  ImageLoadStoreEarlyFragmentTestsTest *this_local;
  
  prepareProgramDetails
            (this,
             "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(r32f) uniform image2D u_image;\n\nvoid main()\n{\n    vec4 color = vec4(1.0, 0, 0, 0);\n\n    imageStore(u_image, ivec2(gl_FragCoord.xy), color);\n\n    discard;\n}\n\n"
             ,
             "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nuniform float u_depth;\n\nvoid main()\n{\n    // Left-bottom\n    gl_Position = vec4(-1, -1, u_depth, 1);\n    EmitVertex();\n\n    // Left-top\n    gl_Position = vec4(-1,  1, u_depth, 1);\n    EmitVertex();\n\n    // Right-bottom\n    gl_Position = vec4( 1, -1, u_depth, 1);\n    EmitVertex();\n\n    // Right-top\n    gl_Position = vec4( 1,  1, u_depth, 1);\n    EmitVertex();\n}\n\n"
             ,
             "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n}\n\n"
             ,&this->m_disabled_early_tests);
  prepareProgramDetails
            (this,
             "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(early_fragment_tests) in;\n\nlayout(r32f) uniform image2D u_image;\n\nvoid main()\n{\n    vec4 color = vec4(1.0, 0, 0, 0);\n\n    imageStore(u_image, ivec2(gl_FragCoord.xy), color);\n\n    discard;\n}\n\n"
             ,
             "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nuniform float u_depth;\n\nvoid main()\n{\n    // Left-bottom\n    gl_Position = vec4(-1, -1, u_depth, 1);\n    EmitVertex();\n\n    // Left-top\n    gl_Position = vec4(-1,  1, u_depth, 1);\n    EmitVertex();\n\n    // Right-bottom\n    gl_Position = vec4( 1, -1, u_depth, 1);\n    EmitVertex();\n\n    // Right-top\n    gl_Position = vec4( 1,  1, u_depth, 1);\n    EmitVertex();\n}\n\n"
             ,
             "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n}\n\n"
             ,&this->m_enabled_early_tests);
  return;
}

Assistant:

void buildPrograms()
	{
		static const char* const fragment_shader_with_disabled_early_tests =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(r32f) uniform image2D u_image;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    vec4 color = vec4(1.0, 0, 0, 0);\n"
			"\n"
			"    imageStore(u_image, ivec2(gl_FragCoord.xy), color);\n"
			"\n"
			"    discard;\n"
			"}\n\n";

		static const char* const fragment_shader_with_enabled_early_tests =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(early_fragment_tests) in;\n"
			"\n"
			"layout(r32f) uniform image2D u_image;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    vec4 color = vec4(1.0, 0, 0, 0);\n"
			"\n"
			"    imageStore(u_image, ivec2(gl_FragCoord.xy), color);\n"
			"\n"
			"    discard;\n"
			"}\n\n";

		static const char* const geometry_shader_code = "#version 400 core\n"
														"#extension GL_ARB_shader_image_load_store : require\n"
														"\n"
														"precision highp float;\n"
														"\n"
														"layout(points)                           in;\n"
														"layout(triangle_strip, max_vertices = 4) out;\n"
														"\n"
														"uniform float u_depth;\n"
														"\n"
														"void main()\n"
														"{\n"
														"    // Left-bottom\n"
														"    gl_Position = vec4(-1, -1, u_depth, 1);\n"
														"    EmitVertex();\n"
														"\n"
														"    // Left-top\n"
														"    gl_Position = vec4(-1,  1, u_depth, 1);\n"
														"    EmitVertex();\n"
														"\n"
														"    // Right-bottom\n"
														"    gl_Position = vec4( 1, -1, u_depth, 1);\n"
														"    EmitVertex();\n"
														"\n"
														"    // Right-top\n"
														"    gl_Position = vec4( 1,  1, u_depth, 1);\n"
														"    EmitVertex();\n"
														"}\n\n";

		static const char* const vertex_shader_code = "#version 400 core\n"
													  "#extension GL_ARB_shader_image_load_store : require\n"
													  "\n"
													  "precision highp float;\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "}\n\n";

		prepareProgramDetails(fragment_shader_with_disabled_early_tests, geometry_shader_code, vertex_shader_code,
							  m_disabled_early_tests);

		prepareProgramDetails(fragment_shader_with_enabled_early_tests, geometry_shader_code, vertex_shader_code,
							  m_enabled_early_tests);
	}